

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_> *
__thiscall
slang::ast::Compilation::getPackages
          (vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
           *__return_storage_ptr__,Compilation *this)

{
  char_pointer puVar1;
  uint uVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  ulong uVar3;
  _Cat _Var4;
  char_pointer puVar5;
  uint uVar6;
  const_iterator __position;
  ulong uVar7;
  char_pointer puVar8;
  type *name;
  undefined1 auVar9 [16];
  iterator iVar10;
  
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar10 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
           ::begin(&(this->packageMap).table_);
  iVar10.p_ = iVar10.p_;
joined_r0x002e3f25:
  if (iVar10.p_ == (table_element_pointer)0x0) {
    return __return_storage_ptr__;
  }
  __position._M_current =
       (__return_storage_ptr__->
       super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(__return_storage_ptr__->
                super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 3;
  while (uVar3 = uVar7, 0 < (long)uVar3) {
    uVar7 = uVar3 >> 1;
    __y._M_len = (__position._M_current[uVar7]->super_Symbol).name._M_len;
    __y._M_str = (__position._M_current[uVar7]->super_Symbol).name._M_str;
    _Var4 = std::operator<=><char,std::char_traits<char>>((iVar10.p_)->first,__y);
    if (-1 < _Var4._M_value) {
      __position._M_current = __position._M_current + uVar7 + 1;
      uVar7 = ~uVar7 + uVar3;
    }
  }
  std::vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  ::insert(__return_storage_ptr__,__position,(value_type *)&(iVar10.p_)->second);
  puVar5 = iVar10.pc_ + 2;
  do {
    puVar8 = puVar5;
    puVar5 = iVar10.pc_;
    iVar10.p_ = iVar10.p_ + 1;
    if (((uint)iVar10.pc_ & 0xf) == 0xe) goto LAB_002e3fc8;
    puVar1 = puVar8 + -1;
    iVar10.p_ = iVar10.p_;
    iVar10.pc_ = puVar5 + 1;
    puVar5 = puVar8 + 1;
  } while (*puVar1 == '\0');
  puVar8 = puVar8 + -1;
  if (*puVar1 == '\x01') {
    iVar10.p_ = (table_element_pointer)0x0;
  }
  goto LAB_002e3fb8;
LAB_002e3fc8:
  do {
    auVar9[0] = -(*puVar8 == '\0');
    auVar9[1] = -(puVar8[1] == '\0');
    auVar9[2] = -(puVar8[2] == '\0');
    auVar9[3] = -(puVar8[3] == '\0');
    auVar9[4] = -(puVar8[4] == '\0');
    auVar9[5] = -(puVar8[5] == '\0');
    auVar9[6] = -(puVar8[6] == '\0');
    auVar9[7] = -(puVar8[7] == '\0');
    auVar9[8] = -(puVar8[8] == '\0');
    auVar9[9] = -(puVar8[9] == '\0');
    auVar9[10] = -(puVar8[10] == '\0');
    auVar9[0xb] = -(puVar8[0xb] == '\0');
    auVar9[0xc] = -(puVar8[0xc] == '\0');
    auVar9[0xd] = -(puVar8[0xd] == '\0');
    auVar9[0xe] = -(puVar8[0xe] == '\0');
    auVar9[0xf] = -(puVar8[0xf] == '\0');
    uVar6 = (uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe);
    if (uVar6 == 0x7fff) {
      puVar8 = puVar8 + 0x10;
      iVar10.p_ = iVar10.p_ + 0xf;
    }
    else {
      uVar2 = 0;
      if ((uVar6 ^ 0x7fff) != 0) {
        for (; ((uVar6 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (puVar8[uVar2] == '\x01') {
        iVar10.p_ = (table_element_pointer)0x0;
      }
      else {
        puVar8 = puVar8 + uVar2;
        iVar10.p_ = iVar10.p_ + uVar2;
      }
    }
  } while (uVar6 == 0x7fff);
LAB_002e3fb8:
  iVar10.p_ = iVar10.p_;
  iVar10.pc_ = puVar8;
  goto joined_r0x002e3f25;
}

Assistant:

std::vector<const PackageSymbol*> Compilation::getPackages() const {
    std::vector<const PackageSymbol*> result;
    for (auto& [name, pkg] : packageMap) {
        result.insert(
            std::ranges::upper_bound(result, name, {}, [](auto item) { return item->name; }), pkg);
    }
    return result;
}